

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

void __thiscall glu::TextureCubeArray::upload(TextureCubeArray *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deBool dVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *this_01;
  TextureFormat *pTVar9;
  TransferFormat TVar10;
  ConstPixelBufferAccess *pCVar11;
  void *pvVar12;
  undefined1 local_a0 [8];
  ConstPixelBufferAccess access;
  int levelNdx;
  deUint32 local_68;
  deUint32 dStack_64;
  TransferFormat transferFormat;
  allocator<char> local_49;
  string local_48;
  long local_28;
  Functions *gl;
  TextureCubeArray *this_local;
  
  gl = (Functions *)this;
  iVar3 = (*this->m_context->_vptr_RenderContext[3])();
  local_28 = CONCAT44(extraout_var,iVar3);
  if (*(long *)(local_28 + 0x1320) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"glTexImage3D() is not supported",&local_49);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_48);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  while ((dVar4 = ::deGetFalse(), dVar4 == 0 && (this->m_glTexture != 0))) {
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      (**(code **)(local_28 + 0xb8))(0x9009,this->m_glTexture);
      pcVar1 = *(code **)(local_28 + 0xff0);
      pTVar9 = tcu::TextureLevelPyramid::getFormat(&(this->m_refTexture).super_TextureLevelPyramid);
      iVar3 = computePixelStore(pTVar9);
      (*pcVar1)(0xcf5,iVar3);
      dVar5 = (**(code **)(local_28 + 0x800))();
      checkError(dVar5,"Texture upload failed",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x32a);
      pTVar9 = tcu::TextureLevelPyramid::getFormat(&(this->m_refTexture).super_TextureLevelPyramid);
      TVar10 = getTransferFormat(*pTVar9);
      for (access.m_data._4_4_ = 0; iVar3 = access.m_data._4_4_,
          iVar6 = tcu::TextureLevelPyramid::getNumLevels
                            (&(this->m_refTexture).super_TextureLevelPyramid), iVar3 < iVar6;
          access.m_data._4_4_ = access.m_data._4_4_ + 1) {
        bVar2 = tcu::TextureLevelPyramid::isLevelEmpty
                          (&(this->m_refTexture).super_TextureLevelPyramid,access.m_data._4_4_);
        if (!bVar2) {
          pCVar11 = &tcu::TextureLevelPyramid::getLevel
                               (&(this->m_refTexture).super_TextureLevelPyramid,access.m_data._4_4_)
                     ->super_ConstPixelBufferAccess;
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_a0,pCVar11);
          iVar3 = access.m_data._4_4_;
          pcVar1 = *(code **)(local_28 + 0x1320);
          dVar5 = this->m_format;
          iVar6 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_a0);
          iVar7 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_a0);
          iVar8 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)local_a0);
          local_68 = TVar10.format;
          dStack_64 = TVar10.dataType;
          pvVar12 = tcu::ConstPixelBufferAccess::getDataPtr((ConstPixelBufferAccess *)local_a0);
          (*pcVar1)(0x9009,iVar3,dVar5,iVar6,iVar7,iVar8,0,local_68,dStack_64,pvVar12);
        }
      }
      dVar5 = (**(code **)(local_28 + 0x800))();
      checkError(dVar5,"Texture upload failed",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x339);
      return;
    }
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"m_glTexture",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x327);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void TextureCubeArray::upload (void)
{
	const glw::Functions& gl = m_context.getFunctions();

	if (!gl.texImage3D)
		throw tcu::NotSupportedError("glTexImage3D() is not supported");

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, m_glTexture);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(m_refTexture.getFormat()));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");

	TransferFormat transferFormat = getTransferFormat(m_refTexture.getFormat());

	for (int levelNdx = 0; levelNdx < m_refTexture.getNumLevels(); levelNdx++)
	{
		if (m_refTexture.isLevelEmpty(levelNdx))
			continue; // Don't upload.

		tcu::ConstPixelBufferAccess access = m_refTexture.getLevel(levelNdx);
		DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*access.getWidth());
		DE_ASSERT(access.getSlicePitch() == access.getFormat().getPixelSize()*access.getWidth()*access.getHeight());
		gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, levelNdx, m_format, access.getWidth(), access.getHeight(), access.getDepth(), 0 /* border */, transferFormat.format, transferFormat.dataType, access.getDataPtr());
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}